

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

_Bool set_force_zeromv_skip_for_sb
                (AV1_COMP *cpi,MACROBLOCK *x,TileInfo *tile,VP128x128 *vt,uint *uv_sad,int mi_row,
                int mi_col,uint y_sad,BLOCK_SIZE bsize)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  AV1_COMP *in_R8;
  int in_R9D;
  bool bVar5;
  uint thresh_exit_part_uv;
  uint thresh_exit_part_y;
  int block_height;
  int block_width;
  int shift;
  AV1_COMMON *cm;
  uint local_54;
  int in_stack_ffffffffffffffc8;
  _Bool local_1;
  
  lVar4 = in_RDI + 0x3bf80;
  _Var1 = is_set_force_zeromv_skip_based_on_src_sad
                    (*(int *)(in_RDI + 0x60dd8),*(SOURCE_SAD *)(in_RSI + 0x15d60));
  if (_Var1) {
    bVar5 = *(int *)(in_RDI + 0x60d64) != 0;
    uVar2 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [*(byte *)(*(long *)(lVar4 + 0x6088) + 0x1c)];
    uVar3 = *(int *)(in_RDI + 0x9d6ac + (ulong)(byte)cm * 4) << bVar5;
    local_54 = (uVar3 * 3 >> 2) << bVar5;
    if ((*(int *)(in_RSI + 0x15d60) != 0) && (*(int *)(in_RDI + 0x60db0) == 1)) {
      local_54 = local_54 >> 3;
    }
    if ((((*(int *)(in_RDX + 0xc) <
           (int)(thresh_exit_part_y +
                "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [*(byte *)(*(long *)(lVar4 + 0x6088) + 0x1c)])) ||
         (*(int *)(in_RDX + 4) < (int)(in_R9D + uVar2))) || (uVar3 <= (uint)block_width)) ||
       ((local_54 <= *(uint *)&in_R8->ppi || (local_54 <= *(uint *)((long)&in_R8->ppi + 4))))) {
      if ((*(int *)(in_RSI + 0x15d60) == 0) && (1 < *(int *)(in_RDI + 0x60db0))) {
        *(undefined4 *)(in_RSI + 0x15240) = 2;
      }
      local_1 = false;
    }
    else {
      set_block_size(in_R8,in_R9D,in_stack_ffffffffffffffc8,(BLOCK_SIZE)((ulong)lVar4 >> 0x38));
      *(undefined4 *)(in_RSI + 0x15240) = 1;
      aom_free((void *)CONCAT44(uVar2,uVar3));
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool set_force_zeromv_skip_for_sb(
    AV1_COMP *cpi, MACROBLOCK *x, const TileInfo *const tile, VP128x128 *vt,
    unsigned int *uv_sad, int mi_row, int mi_col, unsigned int y_sad,
    BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  if (!is_set_force_zeromv_skip_based_on_src_sad(
          cpi->sf.rt_sf.set_zeromv_skip_based_on_source_sad,
          x->content_state_sb.source_sad_nonrd))
    return false;
  int shift = cpi->sf.rt_sf.increase_source_sad_thresh ? 1 : 0;
  const int block_width = mi_size_wide[cm->seq_params->sb_size];
  const int block_height = mi_size_high[cm->seq_params->sb_size];
  const unsigned int thresh_exit_part_y =
      cpi->zeromv_skip_thresh_exit_part[bsize] << shift;
  unsigned int thresh_exit_part_uv =
      CALC_CHROMA_THRESH_FOR_ZEROMV_SKIP(thresh_exit_part_y) << shift;
  // Be more aggressive in UV threshold if source_sad >= VeryLowSad
  // to suppreess visual artifact caused by the speed feature:
  // set_zeromv_skip_based_on_source_sad = 2. For now only for
  // part_early_exit_zeromv = 1.
  if (x->content_state_sb.source_sad_nonrd >= kVeryLowSad &&
      cpi->sf.rt_sf.part_early_exit_zeromv == 1)
    thresh_exit_part_uv = thresh_exit_part_uv >> 3;
  if (mi_col + block_width <= tile->mi_col_end &&
      mi_row + block_height <= tile->mi_row_end && y_sad < thresh_exit_part_y &&
      uv_sad[0] < thresh_exit_part_uv && uv_sad[1] < thresh_exit_part_uv) {
    set_block_size(cpi, mi_row, mi_col, bsize);
    x->force_zeromv_skip_for_sb = 1;
    aom_free(vt);
    // Partition shape is set here at SB level.
    // Exit needs to happen from av1_choose_var_based_partitioning().
    return true;
  } else if (x->content_state_sb.source_sad_nonrd == kZeroSad &&
             cpi->sf.rt_sf.part_early_exit_zeromv >= 2)
    x->force_zeromv_skip_for_sb = 2;
  return false;
}